

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaCompareValues(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  xmlSchemaWhitespaceValueType local_28;
  xmlSchemaWhitespaceValueType local_24;
  xmlSchemaWhitespaceValueType yws;
  xmlSchemaWhitespaceValueType xws;
  xmlSchemaValPtr y_local;
  xmlSchemaValPtr x_local;
  
  if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
    x_local._4_4_ = -2;
  }
  else {
    if (x->type == XML_SCHEMAS_STRING) {
      local_24 = XML_SCHEMA_WHITESPACE_PRESERVE;
    }
    else if (x->type == XML_SCHEMAS_NORMSTRING) {
      local_24 = XML_SCHEMA_WHITESPACE_REPLACE;
    }
    else {
      local_24 = XML_SCHEMA_WHITESPACE_COLLAPSE;
    }
    if (y->type == XML_SCHEMAS_STRING) {
      local_28 = XML_SCHEMA_WHITESPACE_PRESERVE;
    }
    else if (y->type == XML_SCHEMAS_NORMSTRING) {
      local_28 = XML_SCHEMA_WHITESPACE_REPLACE;
    }
    else {
      local_28 = XML_SCHEMA_WHITESPACE_COLLAPSE;
    }
    x_local._4_4_ =
         xmlSchemaCompareValuesInternal
                   (x->type,x,(xmlChar *)0x0,local_24,y->type,y,(xmlChar *)0x0,local_28);
  }
  return x_local._4_4_;
}

Assistant:

int
xmlSchemaCompareValues(xmlSchemaValPtr x, xmlSchemaValPtr y) {
    xmlSchemaWhitespaceValueType xws, yws;

    if ((x == NULL) || (y == NULL))
        return(-2);
    if (x->type == XML_SCHEMAS_STRING)
	xws = XML_SCHEMA_WHITESPACE_PRESERVE;
    else if (x->type == XML_SCHEMAS_NORMSTRING)
        xws = XML_SCHEMA_WHITESPACE_REPLACE;
    else
        xws = XML_SCHEMA_WHITESPACE_COLLAPSE;

    if (y->type == XML_SCHEMAS_STRING)
	yws = XML_SCHEMA_WHITESPACE_PRESERVE;
    else if (y->type == XML_SCHEMAS_NORMSTRING)
        yws = XML_SCHEMA_WHITESPACE_REPLACE;
    else
        yws = XML_SCHEMA_WHITESPACE_COLLAPSE;

    return(xmlSchemaCompareValuesInternal(x->type, x, NULL, xws, y->type,
	y, NULL, yws));
}